

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbox2d.cpp
# Opt level: O1

void masc::polygon::saveSVG(string *svg_filename,c_ply *ply,obb *box)

{
  list<std::vector<svg::Point,_std::allocator<svg::Point>_>,_std::allocator<std::vector<svg::Point,_std::allocator<svg::Point>_>_>_>
  *this;
  list<std::vector<svg::Point,_std::allocator<svg::Point>_>,_std::allocator<std::vector<svg::Point,_std::allocator<svg::Point>_>_>_>
  *this_00;
  double dVar1;
  double dVar2;
  pointer pcVar3;
  double dVar4;
  Point2d *pPVar5;
  ostream *poVar6;
  float fVar7;
  double dVar8;
  Document local_1a0;
  Polygon local_130;
  Polygon local_b0;
  
  fVar7 = c_ply::getRadius(ply);
  pPVar5 = c_ply::getCenter(ply);
  dVar8 = (double)fVar7 * 2.5;
  dVar4 = (double)fVar7 * 1.25;
  dVar1 = pPVar5->v[0];
  dVar2 = pPVar5->v[1];
  local_1a0.file_name._M_dataplus._M_p = (pointer)&local_1a0.file_name.field_2;
  pcVar3 = (svg_filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,pcVar3,pcVar3 + svg_filename->_M_string_length);
  local_1a0.layout.scale = 1.0;
  local_1a0.layout.origin = BottomLeft;
  local_1a0.body_nodes_str._M_dataplus._M_p = (pointer)&local_1a0.body_nodes_str.field_2;
  local_1a0.body_nodes_str._M_string_length = 0;
  local_1a0.body_nodes_str.field_2._M_local_buf[0] = '\0';
  this = &local_b0.boundaries;
  local_b0.super_Shape.fill.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Fill_00110c50;
  local_b0.super_Shape.fill.color.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Serializeable_00110ca0;
  local_b0.super_Shape.fill.color.transparent = false;
  local_b0.super_Shape.fill.color.red = 0xff;
  local_b0.super_Shape.fill.color.green = 0xff;
  local_b0.super_Shape.fill.color.blue = 0;
  local_b0.super_Shape.stroke.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Stroke_00110ce0;
  local_b0.super_Shape.stroke.width = 0.5;
  local_b0.super_Shape.stroke.color.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Serializeable_00110ca0;
  local_b0.super_Shape.stroke.color.transparent = false;
  local_b0.super_Shape.stroke.color.red = 0;
  local_b0.super_Shape.stroke.color.green = 0;
  local_b0.super_Shape.stroke.color.blue = 0;
  local_b0.super_Shape.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Polygon_00110d20;
  local_b0.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0.boundaries.
  super__List_base<std::vector<svg::Point,_std::allocator<svg::Point>_>,_std::allocator<std::vector<svg::Point,_std::allocator<svg::Point>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_1a0.layout.dimensions.width = dVar8;
  local_1a0.layout.dimensions.height = dVar8;
  local_1a0.layout.origin_offset.x = dVar4 - dVar1;
  local_1a0.layout.origin_offset.y = dVar4 - dVar2;
  local_b0.boundaries.
  super__List_base<std::vector<svg::Point,_std::allocator<svg::Point>_>,_std::allocator<std::vector<svg::Point,_std::allocator<svg::Point>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
  local_b0.boundaries.
  super__List_base<std::vector<svg::Point,_std::allocator<svg::Point>_>,_std::allocator<std::vector<svg::Point,_std::allocator<svg::Point>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  box2ply(box,&local_b0);
  svg::Document::operator<<(&local_1a0,&local_b0.super_Shape);
  this_00 = &local_130.boundaries;
  local_130.super_Shape.fill.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Fill_00110c50;
  local_130.super_Shape.fill.color.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Serializeable_00110ca0;
  local_130.super_Shape.fill.color.transparent = false;
  local_130.super_Shape.fill.color.red = 0xc0;
  local_130.super_Shape.fill.color.green = 0xc0;
  local_130.super_Shape.fill.color.blue = 0xc0;
  local_130.super_Shape.stroke.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Stroke_00110ce0;
  local_130.super_Shape.stroke.width = 0.5;
  local_130.super_Shape.stroke.color.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Serializeable_00110ca0;
  local_130.super_Shape.stroke.color.transparent = false;
  local_130.super_Shape.stroke.color.red = 0;
  local_130.super_Shape.stroke.color.green = 0;
  local_130.super_Shape.stroke.color.blue = 0;
  local_130.super_Shape.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Polygon_00110d20;
  local_130.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_130.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_130.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_130.boundaries.
  super__List_base<std::vector<svg::Point,_std::allocator<svg::Point>_>,_std::allocator<std::vector<svg::Point,_std::allocator<svg::Point>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_130.boundaries.
  super__List_base<std::vector<svg::Point,_std::allocator<svg::Point>_>,_std::allocator<std::vector<svg::Point,_std::allocator<svg::Point>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  local_130.boundaries.
  super__List_base<std::vector<svg::Point,_std::allocator<svg::Point>_>,_std::allocator<std::vector<svg::Point,_std::allocator<svg::Point>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  ply2ply(ply,&local_130);
  svg::Document::operator<<(&local_1a0,&local_130.super_Shape);
  svg::Document::save(&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- Saved ",8);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(svg_filename->_M_dataplus)._M_p,
                      svg_filename->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  local_130.super_Shape.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Polygon_00110d20;
  std::__cxx11::
  _List_base<std::vector<svg::Point,_std::allocator<svg::Point>_>,_std::allocator<std::vector<svg::Point,_std::allocator<svg::Point>_>_>_>
  ::_M_clear(&this_00->
              super__List_base<std::vector<svg::Point,_std::allocator<svg::Point>_>,_std::allocator<std::vector<svg::Point,_std::allocator<svg::Point>_>_>_>
            );
  if (local_130.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  local_b0.super_Shape.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Polygon_00110d20;
  std::__cxx11::
  _List_base<std::vector<svg::Point,_std::allocator<svg::Point>_>,_std::allocator<std::vector<svg::Point,_std::allocator<svg::Point>_>_>_>
  ::_M_clear(&this->
              super__List_base<std::vector<svg::Point,_std::allocator<svg::Point>_>,_std::allocator<std::vector<svg::Point,_std::allocator<svg::Point>_>_>_>
            );
  if (local_b0.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.body_nodes_str._M_dataplus._M_p != &local_1a0.body_nodes_str.field_2) {
    operator_delete(local_1a0.body_nodes_str._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.file_name._M_dataplus._M_p != &local_1a0.file_name.field_2) {
    operator_delete(local_1a0.file_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void saveSVG(string svg_filename, masc::polygon::c_ply& ply, const masc::polygon::obb& box)
{
  //cout<<"??"<<endl;
    //create a svg file
    //char svg_filename[256];
    //sprintf(svg_filename, "%s.svg", img_name.c_str());
    auto R=ply.getRadius();
    auto center=ply.getCenter();

    //cout<<"??"<<endl;
    svg::Dimensions dimensions(R*2.5, R*2.5);
    svg::Document doc(svg_filename, svg::Layout(dimensions, svg::Layout::BottomLeft, 1, svg::Point(-center[0]+R*1.25, -center[1]+R*1.25)));

    //------------------------------------------------------------------
    //draw the external boundary
    ///cout<<"boundary"<<endl;
    svg::Polygon box_bd(svg::Fill(svg::Color::Yellow), svg::Stroke(0.5, svg::Color::Black));
    box2ply(box, box_bd);
    doc << box_bd;

//cout<<"poly"<<endl;
    svg::Polygon poly_bd(svg::Fill(svg::Color::Silver), svg::Stroke(0.5, svg::Color::Black));
    ply2ply(ply, poly_bd);
    doc << poly_bd;

    doc.save();
    cout << "- Saved " << svg_filename << endl;
}